

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O2

UINT8 device_start_okim6258(OKIM6258_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  UINT8 UVar2;
  DEV_DATA DVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  double dVar9;
  
  DVar3.chipInf = calloc(1,0x68);
  if ((DEV_DATA *)DVar3.chipInf == (DEV_DATA *)0x0) {
    UVar2 = 0xff;
  }
  else {
    UVar1 = (cfg->_genCfg).clock;
    *(UINT32 *)((long)DVar3.chipInf + 0x4c) = UVar1;
    uVar4 = cfg->divider & 3;
    *(char *)((long)DVar3.chipInf + 0x2c) = (char)uVar4;
    UVar2 = cfg->adpcmBits;
    if (UVar2 == '\0') {
      UVar2 = '\x04';
    }
    *(UINT8 *)((long)DVar3.chipInf + 0x2d) = UVar2;
    if (tables_computed == '\0') {
      piVar8 = diff_lookup;
      for (lVar7 = 0; lVar7 != 0x31; lVar7 = lVar7 + 1) {
        dVar9 = pow(1.1,(double)(int)lVar7);
        dVar9 = floor(dVar9 * 16.0);
        iVar5 = (int)dVar9;
        for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 4) {
          *(int *)((long)piVar8 + lVar6) =
               (*(int *)(&DAT_00168784 + lVar6 * 4) * iVar5 + iVar5 / 8 +
               *(int *)(&DAT_0016878c + lVar6 * 4) * (iVar5 / 4) +
               *(int *)(&DAT_00168788 + lVar6 * 4) * (iVar5 / 2)) * (&compute_tables_nbl2bit)[lVar6]
          ;
        }
        piVar8 = piVar8 + 0x10;
      }
      tables_computed = '\x01';
    }
    *(UINT32 *)((long)DVar3.chipInf + 0x24) = UVar1;
    *(char *)((long)DVar3.chipInf + 0x46) = (char)UVar1;
    *(char *)((long)DVar3.chipInf + 0x47) = (char)(UVar1 >> 8);
    *(char *)&((DEV_DATA *)((long)DVar3.chipInf + 0x48))->chipInf = (char)(UVar1 >> 0x10);
    *(char *)((long)DVar3.chipInf + 0x49) = (char)(UVar1 >> 0x18);
    uVar4 = dividers[uVar4];
    *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 0x28))->chipInf = uVar4;
    UVar2 = '\n';
    if (cfg->outputBits != '\0') {
      UVar2 = cfg->outputBits;
    }
    *(UINT8 *)((long)DVar3.chipInf + 0x31) = UVar2;
    *(short *)((long)DVar3.chipInf + 0x32) = (short)(-1 << (0xc - UVar2 & 0x1f));
    *(undefined2 *)((long)DVar3.chipInf + 0x34) = 0xfffe;
    *(void **)DVar3.chipInf = DVar3.chipInf;
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = ((uVar4 >> 1) + UVar1) / uVar4;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    UVar2 = '\0';
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_okim6258(const OKIM6258_CFG* cfg, DEV_INFO* retDevInf)
{
	okim6258_state *info;

	info = (okim6258_state *)calloc(1, sizeof(okim6258_state));
	if (info == NULL)
		return 0xFF;

	info->initial_clock = cfg->_genCfg.clock;
	info->start_divider = cfg->divider & 0x03;
	info->adpcm_type = cfg->adpcmBits;
	if (! info->adpcm_type)
		info->adpcm_type = 4;

	compute_tables();

	info->master_clock = info->initial_clock;
	WriteLE32(info->clock_buffer, info->master_clock);
	info->divider = dividers[info->start_divider];
	info->SmpRateFunc = NULL;

	info->output_bits = cfg->outputBits;
	if (! info->output_bits)
		info->output_bits = 10;
	// D/A precision is 10-bits but 12-bit data can be output serially to an external DAC
	info->output_mask = ~((1 << (12 - info->output_bits)) - 1);

	info->signal = -2;
	info->step = 0;

	okim6258_set_mute_mask(info, 0x00);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, get_vclk(info), &devDef);
	return 0x00;
}